

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * embree::FileName::executableFolder(void)

{
  FileName *in_RDI;
  string local_48 [32];
  string *in_stack_ffffffffffffffd8;
  FileName *in_stack_ffffffffffffffe0;
  
  getExecutableFileName_abi_cxx11_();
  FileName(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  path((FileName *)in_stack_ffffffffffffffd8);
  ~FileName((FileName *)0x4d3b11);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

FileName FileName::executableFolder() {
    return FileName(getExecutableFileName()).path();
  }